

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

void __thiscall
rangeless::fn::impl::
maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
::maybe(maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
        *this,maybe<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
              *other)

{
  this->m_empty = true;
  if ((other->m_empty == false) &&
     (reset(this,(vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                  *)other), other->m_empty == false)) {
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               *)other);
    other->m_empty = true;
  }
  return;
}

Assistant:

maybe(maybe&& other) noexcept
        {        //^^ by value instead?
            if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            }
        }